

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O0

void valueContentToJson(QCborValue *v,QByteArray *json,int indent,bool compact)

{
  long lVar1;
  bool bVar2;
  Type base;
  undefined1 in_CL;
  undefined4 in_EDX;
  QCborContainerPrivate *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  double d;
  Type type;
  QByteArray *in_stack_ffffffffffffff08;
  char cVar3;
  undefined4 in_stack_ffffffffffffff10;
  QString *in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff20;
  undefined1 compact_00;
  Type TVar4;
  undefined3 in_stack_ffffffffffffff28;
  uint uVar5;
  QStringView in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = CONCAT13(in_CL,in_stack_ffffffffffffff28) & 0x1ffffff;
  base = QCborValue::type(in_RDI);
  if (base == Integer) {
    QCborValue::toInteger
              ((QCborValue *)(ulong)in_stack_ffffffffffffff20,(qint64)in_stack_ffffffffffffff18);
    QByteArray::number((qlonglong)in_stack_ffffffffffffff18,base);
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(base,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08);
    QByteArray::~QByteArray((QByteArray *)0x1be6e8);
  }
  else if (base == String) {
    TVar4 = base;
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(0x60,in_stack_ffffffffffffff10),
               (char)((ulong)in_stack_ffffffffffffff08 >> 0x38));
    QString::QString((QString *)0x1be787);
    QCborValue::toString
              ((QCborValue *)CONCAT44(in_EDX,uVar5),
               (QString *)CONCAT44(TVar4,in_stack_ffffffffffffff20));
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT44(TVar4,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18);
    escapedString(in_stack_ffffffffffffffa0);
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(base,in_stack_ffffffffffffff10),(QByteArray *)in_RDI);
    cVar3 = (char)((ulong)in_RDI >> 0x38);
    QByteArray::~QByteArray((QByteArray *)0x1be7ee);
    QString::~QString((QString *)0x1be7fb);
    QString::~QString((QString *)0x1be805);
    QByteArray::operator+=((QByteArray *)CONCAT44(base,in_stack_ffffffffffffff10),cVar3);
  }
  else if (base == Array) {
    TVar4 = base;
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(0x80,in_stack_ffffffffffffff10),
               (char *)in_stack_ffffffffffffff08);
    QJsonPrivate::Value::container(in_RDI);
    arrayContentToJson((QCborContainerPrivate *)CONCAT44(in_EDX,uVar5),
                       (QByteArray *)CONCAT44(TVar4,in_stack_ffffffffffffff20),
                       (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
    QByteArray::QByteArray
              ((QByteArray *)in_stack_ffffffffffffff18,CONCAT44(base,in_stack_ffffffffffffff10),
               (char)((ulong)in_stack_ffffffffffffff08 >> 0x38));
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(base,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08);
    cVar3 = (char)((ulong)in_stack_ffffffffffffff08 >> 0x38);
    QByteArray::~QByteArray((QByteArray *)0x1be8a7);
    QByteArray::operator+=((QByteArray *)CONCAT44(base,in_stack_ffffffffffffff10),cVar3);
  }
  else if (base == Map) {
    TVar4 = base;
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(0xa0,in_stack_ffffffffffffff10),
               (char *)in_stack_ffffffffffffff08);
    compact_00 = (undefined1)(in_stack_ffffffffffffff20 >> 0x18);
    QJsonPrivate::Value::container(in_RDI);
    objectContentToJson(in_RSI,(QByteArray *)CONCAT44(in_EDX,uVar5),TVar4,(bool)compact_00);
    QByteArray::QByteArray
              ((QByteArray *)in_stack_ffffffffffffff18,CONCAT44(base,in_stack_ffffffffffffff10),
               (char)((ulong)in_stack_ffffffffffffff08 >> 0x38));
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(base,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08);
    cVar3 = (char)((ulong)in_stack_ffffffffffffff08 >> 0x38);
    QByteArray::~QByteArray((QByteArray *)0x1be949);
    QByteArray::operator+=((QByteArray *)CONCAT44(base,in_stack_ffffffffffffff10),cVar3);
  }
  else if (base == False) {
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(0x114,in_stack_ffffffffffffff10),
               (char *)in_stack_ffffffffffffff08);
  }
  else if (base == True) {
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(0x115,in_stack_ffffffffffffff10),
               (char *)in_stack_ffffffffffffff08);
  }
  else if ((base == Null) || (base != Double)) {
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(base,in_stack_ffffffffffffff10),
               (char *)in_stack_ffffffffffffff08);
  }
  else {
    QCborValue::toDouble
              ((QCborValue *)CONCAT44(0x202,in_stack_ffffffffffffff20),
               (double)in_stack_ffffffffffffff18);
    bVar2 = qt_is_finite(9.03457827232574e-318);
    if (bVar2) {
      QByteArray::number((double)in_RDI,(char)((ulong)in_RSI >> 0x38),(int)in_RSI);
      QByteArray::operator+=
                ((QByteArray *)CONCAT44(base,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08);
      QByteArray::~QByteArray((QByteArray *)0x1be74d);
    }
    else {
      QByteArray::operator+=
                ((QByteArray *)CONCAT44(base,in_stack_ffffffffffffff10),
                 (char *)in_stack_ffffffffffffff08);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void valueContentToJson(const QCborValue &v, QByteArray &json, int indent, bool compact)
{
    QCborValue::Type type = v.type();
    switch (type) {
    case QCborValue::True:
        json += "true";
        break;
    case QCborValue::False:
        json += "false";
        break;
    case QCborValue::Integer:
        json += QByteArray::number(v.toInteger());
        break;
    case QCborValue::Double: {
        const double d = v.toDouble();
        if (qt_is_finite(d))
            json += QByteArray::number(d, 'g', QLocale::FloatingPointShortest);
        else
            json += "null"; // +INF || -INF || NaN (see RFC4627#section2.4)
        break;
    }
    case QCborValue::String:
        json += '"';
        json += escapedString(v.toString());
        json += '"';
        break;
    case QCborValue::Array:
        json += compact ? "[" : "[\n";
        arrayContentToJson(
                QJsonPrivate::Value::container(v), json, indent + (compact ? 0 : 1), compact);
        json += QByteArray(4*indent, ' ');
        json += ']';
        break;
    case QCborValue::Map:
        json += compact ? "{" : "{\n";
        objectContentToJson(
                QJsonPrivate::Value::container(v), json, indent + (compact ? 0 : 1), compact);
        json += QByteArray(4*indent, ' ');
        json += '}';
        break;
    case QCborValue::Null:
    default:
        json += "null";
    }
}